

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

int pulse_context_init(cubeb_conflict *ctx)

{
  _func_pa_context_ptr_pa_mainloop_api_ptr_char_ptr *p_Var1;
  int iVar2;
  pa_context_state_t pVar3;
  pa_mainloop_api *ppVar4;
  pa_context *ppVar5;
  
  if (ctx->context != (pa_context *)0x0) {
    if (ctx->error != 1) {
      __assert_fail("ctx->error == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                    ,0x264,"int pulse_context_init(cubeb *)");
    }
    pulse_context_destroy(ctx);
  }
  p_Var1 = cubeb_pa_context_new;
  ppVar4 = (*cubeb_pa_threaded_mainloop_get_api)(ctx->mainloop);
  ppVar5 = (*p_Var1)(ppVar4,ctx->context_name);
  ctx->context = ppVar5;
  if (ppVar5 != (pa_context *)0x0) {
    (*cubeb_pa_context_set_state_callback)(ppVar5,context_state_callback,ctx);
    (*cubeb_pa_threaded_mainloop_lock)(ctx->mainloop);
    iVar2 = (*cubeb_pa_context_connect)
                      (ctx->context,(char *)0x0,PA_CONTEXT_NOFLAGS,(pa_spawn_api *)0x0);
    if (-1 < iVar2) {
      pVar3 = (*cubeb_pa_context_get_state)(ctx->context);
      while (0xfffffffb < pVar3 - PA_CONTEXT_FAILED) {
        if (pVar3 == PA_CONTEXT_READY) {
          (*cubeb_pa_threaded_mainloop_unlock)(ctx->mainloop);
          ctx->error = 0;
          return 0;
        }
        (*cubeb_pa_threaded_mainloop_wait)(ctx->mainloop);
        pVar3 = (*cubeb_pa_context_get_state)(ctx->context);
      }
    }
    (*cubeb_pa_threaded_mainloop_unlock)(ctx->mainloop);
    pulse_context_destroy(ctx);
    ctx->context = (pa_context *)0x0;
  }
  return -1;
}

Assistant:

static int
pulse_context_init(cubeb * ctx)
{
  int r;

  if (ctx->context) {
    assert(ctx->error == 1);
    pulse_context_destroy(ctx);
  }

  ctx->context = WRAP(pa_context_new)(
      WRAP(pa_threaded_mainloop_get_api)(ctx->mainloop), ctx->context_name);
  if (!ctx->context) {
    return -1;
  }
  WRAP(pa_context_set_state_callback)
  (ctx->context, context_state_callback, ctx);

  WRAP(pa_threaded_mainloop_lock)(ctx->mainloop);
  r = WRAP(pa_context_connect)(ctx->context, NULL, 0, NULL);

  if (r < 0 || wait_until_context_ready(ctx) != 0) {
    WRAP(pa_threaded_mainloop_unlock)(ctx->mainloop);
    pulse_context_destroy(ctx);
    ctx->context = NULL;
    return -1;
  }

  WRAP(pa_threaded_mainloop_unlock)(ctx->mainloop);

  ctx->error = 0;

  return 0;
}